

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNet.cpp
# Opt level: O2

void __thiscall PyreNet::NeuralNet::add(NeuralNet *this,LayerDefinition *newLayer)

{
  pointer pLVar1;
  ActivationFactory *this_00;
  Activation *local_38;
  Activation *activation;
  
  this_00 = ActivationFactory::getInstance();
  std::vector<PyreNet::Layer,_std::allocator<PyreNet::Layer>_>::reserve
            (&this->layers,
             ((long)(this->layers).
                    super__Vector_base<PyreNet::Layer,_std::allocator<PyreNet::Layer>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(this->layers).
                    super__Vector_base<PyreNet::Layer,_std::allocator<PyreNet::Layer>_>._M_impl.
                    super__Vector_impl_data._M_start >> 5) + 1);
  pLVar1 = (this->layers).super__Vector_base<PyreNet::Layer,_std::allocator<PyreNet::Layer>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if ((this->layers).super__Vector_base<PyreNet::Layer,_std::allocator<PyreNet::Layer>_>._M_impl.
      super__Vector_impl_data._M_start == pLVar1) {
    activation._4_4_ = this->inputSize;
  }
  else {
    activation._4_4_ = Layer::size(pLVar1 + -1);
  }
  local_38 = ActivationFactory::getActivation(this_00,newLayer->activation);
  std::vector<PyreNet::Layer,std::allocator<PyreNet::Layer>>::
  emplace_back<int_const&,int&,PyreNet::Activation*&>
            ((vector<PyreNet::Layer,std::allocator<PyreNet::Layer>> *)&this->layers,&newLayer->size,
             (int *)((long)&activation + 4),&local_38);
  return;
}

Assistant:

void NeuralNet::add(const LayerDefinition &newLayer){

        ActivationFactory* activationFactory = ActivationFactory::getInstance();

        this->layers.reserve(this->layers.size() + 1);
        int prevSize;
        if (this->layers.empty()) prevSize = this->inputSize;
        else prevSize = this->layers.back().size();

        Activation* activation = activationFactory->getActivation(newLayer.activation);
        this->layers.emplace_back(newLayer.size, prevSize, activation);
    }